

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDataBarExpandedReader.cpp
# Opt level: O2

Barcode * __thiscall
ZXing::OneD::DataBarExpandedReader::decodePattern
          (Barcode *__return_storage_ptr__,DataBarExpandedReader *this,int rowNumber,
          PatternView *view,
          unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
          *state)

{
  map<int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>_>_>_>
  *this_00;
  int *__k;
  int *piVar1;
  Iterator puVar2;
  Character CVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  size_type sVar7;
  pointer puVar8;
  Character CVar9;
  pointer puVar10;
  bool bVar11;
  uint uVar12;
  int iVar13;
  DecodingState *pDVar14;
  mapped_type *pmVar15;
  iterator iVar16;
  long lVar17;
  BitArray *extraout_RDX;
  BitArray *_bits;
  BitArray *extraout_RDX_00;
  BitArray *extraout_RDX_01;
  Pair *pair;
  string *this_01;
  _Alloc_hider v;
  pointer pPVar18;
  Pair *v_00;
  Pairs *__range2;
  pointer __old_p;
  pointer pPVar19;
  Pairs pairs;
  string txt;
  DetectorResult local_1d8;
  undefined1 local_198 [64];
  undefined8 local_158;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_150;
  DecoderResult local_138;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  Position local_50;
  
  pDVar14 = (state->_M_t).
            super___uniq_ptr_impl<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
            ._M_t.
            super__Tuple_impl<0UL,_ZXing::OneD::RowReader::DecodingState_*,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
            .super__Head_base<0UL,_ZXing::OneD::RowReader::DecodingState_*,_false>._M_head_impl;
  if (pDVar14 == (DecodingState *)0x0) {
    pDVar14 = (DecodingState *)operator_new(0x38);
    pDVar14->_vptr_DecodingState = (_func_int **)&PTR__DBERState_0020a5b0;
    *(undefined4 *)&pDVar14[2]._vptr_DecodingState = 0;
    pDVar14[3]._vptr_DecodingState = (_func_int **)0x0;
    pDVar14[4]._vptr_DecodingState = (_func_int **)(pDVar14 + 2);
    pDVar14[5]._vptr_DecodingState = (_func_int **)(pDVar14 + 2);
    pDVar14[6]._vptr_DecodingState = (_func_int **)0x0;
    (state->_M_t).
    super___uniq_ptr_impl<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
    ._M_t.
    super__Tuple_impl<0UL,_ZXing::OneD::RowReader::DecodingState_*,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
    .super__Head_base<0UL,_ZXing::OneD::RowReader::DecodingState_*,_false>._M_head_impl = pDVar14;
  }
  this_00 = (map<int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>_>_>_>
             *)(pDVar14 + 1);
  local_198._16_8_ = 0;
  local_198._0_8_ = (pointer)0x0;
  local_198._8_8_ = (pointer)0x0;
  local_138._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xffffffff;
  local_138._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xffffffff;
  local_138._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0xffffffff00000000;
  local_138._content.encodings.
  super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_138._content.encodings.
                         super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,1);
  view->_size = 0xf;
  iVar13 = 0;
  CVar3 = (Character)
          local_138._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start;
  local_138._content.encodings.
  super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 1;
  do {
    do {
      local_138._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)CVar3;
      puVar2 = view->_data;
      if ((puVar2 == (Iterator)0x0) ||
         (view->_data = puVar2 + 1, view->_end < puVar2 + (long)view->_size + 1)) {
        CVar9 = (Character)
                local_138._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
        puVar10 = local_138._content.bytes.
                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
        if (iVar13 == 0) {
          view->_base = (Iterator)0x0;
          view->_end = (Iterator)0x0;
          view->_data = (Iterator)0x0;
          *(undefined8 *)&view->_size = 0;
          this_01 = &txt;
          goto LAB_001725bf;
        }
        goto LAB_001724c0;
      }
      bVar11 = IsFinderPattern((uint)puVar2[9],(uint)puVar2[10],(uint)puVar2[0xb],(uint)puVar2[0xc],
                               (uint)puVar2[0xd]);
      puVar10 = local_138._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
      if ((bVar11) &&
         (bVar11 = IsCharacterPair(view),
         puVar10 = local_138._content.bytes.
                   super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage, bVar11)) {
        ReadPair((Pair *)&local_1d8,view,Right);
        local_138._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_1d8._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        puVar10 = local_138._content.bytes.
                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
        local_138._content.encodings.
        super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)local_1d8._bits._bits.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
        local_138._content.encodings.
        super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
        _M_impl.super__Vector_impl_data._M_finish._0_4_ =
             local_1d8._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x;
        local_138._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_1d8._bits._0_8_;
        local_138._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1d8._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_138._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ =
             (uint)local_1d8._bits._bits.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        iVar13 = (uint)local_138._content.bytes.
                       super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
        if (((uint)local_138._content.bytes.
                   super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage != 0) &&
           ((CVar9 = (Character)
                     local_138._content.bytes.
                     super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,
            (uint)local_138._content.bytes.
                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage != 1 ||
            (local_138._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage = puVar10,
            bVar11 = DataBar::IsGuard((uint)view->_data[-1],(uint)view->_data[0xb]), iVar13 = 1,
            CVar9 = (Character)
                    local_138._content.bytes.
                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
            puVar10 = local_138._content.bytes.
                      super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage, bVar11)))) goto LAB_001724c0;
      }
      local_138._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = puVar10;
      puVar2 = view->_data;
      CVar3 = (Character)
              local_138._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    } while ((puVar2 == (Iterator)0x0) ||
            (((view->_data = puVar2 + 1, view->_end < puVar2 + (long)view->_size + 1 ||
              (bVar11 = IsFinderPattern((uint)puVar2[0xd],(uint)puVar2[0xc],(uint)puVar2[0xb],
                                        (uint)puVar2[10],(uint)puVar2[9]),
              CVar3 = (Character)
                      local_138._content.bytes.
                      super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start, !bVar11)) ||
             (bVar11 = IsCharacterPair(view),
             CVar3 = (Character)
                     local_138._content.bytes.
                     super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start, !bVar11))));
    ReadPair((Pair *)&local_1d8,view,Left);
    CVar3.value = local_1d8._bits._width;
    CVar3.checksum = local_1d8._bits._height;
    local_138._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_1d8._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_138._content.encodings.
    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)local_1d8._bits._bits.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    local_138._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_1d8._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    puVar10 = local_138._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    local_138._content.encodings.
    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ =
         local_1d8._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x;
    local_138._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_1d8._bits._0_8_;
    local_138._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ =
         (uint)local_1d8._bits._bits.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
    bVar11 = (uint)local_138._content.bytes.
                   super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage == 0;
    iVar13 = 0;
    CVar9 = (Character)
            local_138._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
    local_138._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_1d8._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_finish;
  } while (bVar11);
LAB_001724c0:
  do {
    local_138._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puVar10;
    local_138._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)CVar9;
    local_138._content.encodings.
    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(rowNumber,
                           (int)local_138._content.encodings.
                                super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                                ._M_impl.super__Vector_impl_data._M_start);
    this_01 = (string *)local_198;
    std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>::push_back
              ((vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_> *)
               this_01,(value_type *)&local_138);
    puVar10 = local_138._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    if ((((int)local_138._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish == -1) ||
        (puVar2 = view->_data, puVar2 == (Iterator)0x0)) ||
       (view->_data = puVar2 + 0x15, view->_end < puVar2 + (long)view->_size + 0x15)) break;
    ReadPair((Pair *)&local_1d8,view,
             (int)~(uint)local_138._content.bytes.
                         super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage >> 0x1f | Right);
    CVar9.value = local_1d8._bits._width;
    CVar9.checksum = local_1d8._bits._height;
    local_138._content.encodings.
    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)local_1d8._bits._bits.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    local_138._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_1d8._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    puVar10 = local_138._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    local_138._content.encodings.
    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ =
         local_1d8._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x;
    local_138._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_1d8._bits._0_8_;
    local_138._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_1d8._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_start;
    puVar8 = local_138._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_138._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ =
         (uint)local_1d8._bits._bits.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
    if (((uint)local_138._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage == 0) ||
       ((local_138._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish._0_4_ =
              (int)local_1d8._bits._bits.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,
        bVar11 = (int)local_138._content.bytes.
                      super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish == -1,
        local_138._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)(Character)
                      local_1d8._bits._bits.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start, bVar11 &&
        (uVar12 = ~(uint)local_138._content.bytes.
                         super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,
        local_138._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar8,
        local_138._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = puVar10,
        bVar11 = DataBar::IsGuard((uint)*(ushort *)
                                         ((long)view->_data +
                                         (ulong)(uVar12 >> 0x1d & 0xfffffff6 | 0x12)),
                                  (uint)view->_data[0xd]),
        CVar9 = (Character)
                local_138._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start,
        puVar10 = local_138._content.bytes.
                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage, !bVar11)))) break;
  } while( true );
  local_138._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = puVar10;
  txt._M_dataplus._M_p = (pointer)local_198._0_8_;
  txt._M_string_length = local_198._8_8_;
  txt.field_2._M_allocated_capacity = local_198._16_8_;
LAB_001725bf:
  (((_Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_> *)
   &this_01->_M_dataplus)->_M_impl).super__Vector_impl_data._M_start = (pointer)0x0;
  this_01->_M_string_length = 0;
  (this_01->field_2)._M_allocated_capacity = 0;
  std::_Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>::
  ~_Vector_base((_Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                 *)local_198);
  sVar7 = txt._M_string_length;
  bVar11 = false;
  for (v = txt._M_dataplus; v._M_p != (pointer)sVar7; v._M_p = v._M_p + 0x24) {
    pmVar15 = std::
              map<int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>_>_>_>
              ::operator[](this_00,&((Pair *)v._M_p)->finder);
    iVar16 = Find<std::vector<ZXing::OneD::DataBar::Pair,std::allocator<ZXing::OneD::DataBar::Pair>>,ZXing::OneD::DataBar::Pair>
                       (pmVar15,(Pair *)v._M_p);
    if (iVar16._M_current ==
        (pmVar15->
        super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>)
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>::
      push_back(pmVar15,(value_type *)v._M_p);
    }
    else {
      (iVar16._M_current)->count = (iVar16._M_current)->count + 1;
      for (; (iVar16._M_current !=
              (pmVar15->
              super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
              )._M_impl.super__Vector_impl_data._M_start &&
             (iVar16._M_current[-1].count < (iVar16._M_current)->count));
          iVar16._M_current = iVar16._M_current + -1) {
        local_138._content.encodings.
        super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
        _M_impl.super__Vector_impl_data._M_finish._0_4_ = iVar16._M_current[-1].count;
        local_138._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = *(pointer *)&iVar16._M_current[-1].left;
        local_138._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = *(pointer *)&iVar16._M_current[-1].right;
        local_138._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = *(pointer *)&iVar16._M_current[-1].finder;
        local_138._content.encodings.
        super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
        _M_impl.super__Vector_impl_data._M_start = *(pointer *)&iVar16._M_current[-1].xStop;
        CVar3 = (iVar16._M_current)->right;
        iVar13 = (iVar16._M_current)->finder;
        iVar4 = (iVar16._M_current)->xStart;
        iVar5 = (iVar16._M_current)->xStop;
        iVar6 = (iVar16._M_current)->y;
        iVar16._M_current[-1].left = (iVar16._M_current)->left;
        iVar16._M_current[-1].right = CVar3;
        iVar16._M_current[-1].finder = iVar13;
        iVar16._M_current[-1].xStart = iVar4;
        iVar16._M_current[-1].xStop = iVar5;
        iVar16._M_current[-1].y = iVar6;
        iVar16._M_current[-1].count = (iVar16._M_current)->count;
        (iVar16._M_current)->left =
             (Character)
             local_138._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
        (iVar16._M_current)->right =
             (Character)
             local_138._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        *(pointer *)&(iVar16._M_current)->finder =
             local_138._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        *(pointer *)&(iVar16._M_current)->xStop =
             local_138._content.encodings.
             super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (iVar16._M_current)->count =
             (int)local_138._content.encodings.
                  super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
    }
    bVar11 = true;
  }
  std::_Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>::
  ~_Vector_base((_Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                 *)&txt);
  if (bVar11) {
    pairs.
    super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    pairs.
    super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pairs.
    super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pmVar15 = std::
              map<int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>_>_>_>
              ::operator[](this_00,&FINDER_A);
    pPVar19 = (pmVar15->
              super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    for (pPVar18 = (pmVar15->
                   super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                   )._M_impl.super__Vector_impl_data._M_start; pPVar18 != pPVar19;
        pPVar18 = pPVar18 + 1) {
      iVar13 = ((pPVar18->left).value / 0xd3 + 5) / 2;
      if (iVar13 <= *(int *)&pDVar14[6]._vptr_DecodingState) {
        std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>::
        push_back(&pairs,pPVar18);
        lVar17 = (long)(iVar13 + -2) * 0x18;
        bVar11 = FindValidSequence<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                           (this_00,(int *)(*(long *)(FINDER_PATTERN_SEQUENCES + lVar17) + 4),
                            (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                            )*(int **)(FINDER_PATTERN_SEQUENCES + lVar17 + 8),&pairs);
        if (bVar11) break;
        pairs.
        super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             pairs.
             super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
      }
    }
    if (pairs.
        super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        pairs.
        super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      memset(__return_storage_ptr__,0,0xd8);
      Result::Result(__return_storage_ptr__);
    }
    else {
      local_138._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_138._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_138._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      BitArray::appendBits
                ((BitArray *)&local_138,
                 ((pairs.
                   super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                   ._M_impl.super__Vector_impl_data._M_start)->right).value,0xc);
      _bits = extraout_RDX;
      pPVar18 = pairs.
                super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                ._M_impl.super__Vector_impl_data._M_start;
      while (pPVar19 = pPVar18 + 1,
            pPVar19 !=
            pairs.
            super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
        BitArray::appendBits((BitArray *)&local_138,(pPVar19->left).value,0xc);
        iVar13 = pPVar18[1].right.value;
        _bits = extraout_RDX_00;
        pPVar18 = pPVar19;
        if (iVar13 != -1) {
          BitArray::appendBits((BitArray *)&local_138,iVar13,0xc);
          _bits = extraout_RDX_01;
        }
      }
      DataBar::DecodeExpandedBits_abi_cxx11_(&txt,(DataBar *)&local_138,_bits);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_138);
      pPVar18 = pairs.
                super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      v_00 = pairs.
             super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
             ._M_impl.super__Vector_impl_data._M_start;
      if (txt._M_string_length == 0) {
        memset(__return_storage_ptr__,0,0xd8);
        Result::Result(__return_storage_ptr__);
      }
      else {
        for (; v_00 != pPVar18; v_00 = v_00 + 1) {
          __k = &v_00->finder;
          pmVar15 = std::
                    map<int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>_>_>_>
                    ::operator[](this_00,__k);
          iVar16 = Find<std::vector<ZXing::OneD::DataBar::Pair,std::allocator<ZXing::OneD::DataBar::Pair>>,ZXing::OneD::DataBar::Pair>
                             (pmVar15,v_00);
          pmVar15 = std::
                    map<int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>_>_>_>
                    ::operator[](this_00,__k);
          if (iVar16._M_current !=
              (pmVar15->
              super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
            piVar1 = &(iVar16._M_current)->count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              pmVar15 = std::
                        map<int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>_>_>_>
                        ::operator[](this_00,__k);
              std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>::
              erase(pmVar15,(const_iterator)iVar16._M_current);
            }
          }
        }
        ByteArray::ByteArray((ByteArray *)&local_68,&txt);
        Content::Content((Content *)local_198,(ByteArray *)&local_68,(SymbologyIdentifier)0x1003065)
        ;
        DecoderResult::DecoderResult(&local_138,(Content *)local_198);
        local_138._lineCount =
             DataBar::EstimateLineCount
                       (pairs.
                        super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        pairs.
                        super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1);
        _Stack_150._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        _Stack_150._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_158 = 0;
        _Stack_150._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        DataBar::EstimatePosition
                  (&local_50,
                   pairs.
                   super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   pairs.
                   super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1);
        local_1d8._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1d8._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1d8._bits._width = 0;
        local_1d8._bits._height = 0;
        local_1d8._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        _Stack_150._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        _Stack_150._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        _Stack_150._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1d8._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[0] =
             local_50.super_array<ZXing::PointT<int>,_4UL>._M_elems[0];
        local_1d8._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[1] =
             local_50.super_array<ZXing::PointT<int>,_4UL>._M_elems[1];
        local_1d8._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[2] =
             local_50.super_array<ZXing::PointT<int>,_4UL>._M_elems[2];
        local_1d8._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[3] =
             local_50.super_array<ZXing::PointT<int>,_4UL>._M_elems[3];
        Result::Result(__return_storage_ptr__,&local_138,&local_1d8,DataBarExpanded);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &local_1d8._bits._bits);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_150)
        ;
        DecoderResult::~DecoderResult(&local_138);
        Content::~Content((Content *)local_198);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_68);
      }
      std::__cxx11::string::~string((string *)&txt);
    }
    std::_Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>::
    ~_Vector_base(&pairs.
                   super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                 );
  }
  else {
    memset(__return_storage_ptr__,0,0xd8);
    Result::Result(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Barcode DataBarExpandedReader::decodePattern(int rowNumber, PatternView& view, std::unique_ptr<RowReader::DecodingState>& state) const
{
#if 0 // non-stacked version
	auto pairs = ReadRowOfPairs<false>(view, rowNumber);

	if (pairs.empty() || !ChecksumIsValid(pairs))
		return {};
#else
	if (!state)
		state.reset(new DBERState);
	auto& allPairs = static_cast<DBERState*>(state.get())->allPairs;

	// Stacked codes can be laid out in a number of ways. The following rules apply:
	//  * the first row starts with FINDER_A in left-to-right (l2r) layout
	//  * pairs in l2r layout start with a space, r2l ones with a bar
	//  * l2r and r2l finders always alternate
	//  * rows may contain any number of pairs
	//  * even rows may be reversed
	//  * a l2r pair that starts with a bar is actually a r2l pair on a reversed line
	//  * the last pair of the symbol may be missing the right character
	//
	// 3 examples: (r == l2r, l == r2l, R/L == r/l but reversed)
	//    r l r l    |    r l     |     r l r
	//    L R L R    |    r       |     l

	if (!Insert(allPairs, ReadRowOfPairs<true>(view, rowNumber)))
		return {};

	auto pairs = FindValidSequence(allPairs);
	if (pairs.empty())
		return {};
#endif

	auto txt = DecodeExpandedBits(BuildBitArray(pairs));
	if (txt.empty())
		return {};

	RemovePairs(allPairs, pairs);

	// TODO: EstimatePosition misses part of the symbol in the stacked case where the last row contains less pairs than
	// the first
	// Symbology identifier: ISO/IEC 24724:2011 Section 9 and GS1 General Specifications 5.1.3 Figure 5.1.3-2
	return {DecoderResult(Content(ByteArray(txt), {'e', '0', 0, AIFlag::GS1}))
				.setLineCount(EstimateLineCount(pairs.front(), pairs.back())),
			{{}, EstimatePosition(pairs.front(), pairs.back())}, BarcodeFormat::DataBarExpanded};
}